

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lobject.c
# Opt level: O0

char * l_str2int(char *s,lua_Integer *result)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ulong local_48;
  int d;
  int neg;
  int empty;
  lua_Unsigned a;
  lua_Integer *result_local;
  char *s_local;
  
  _neg = 0;
  bVar1 = true;
  result_local = (lua_Integer *)s;
  while ((""[(int)((byte)*result_local + 1)] & 8) != 0) {
    result_local = (lua_Integer *)((long)result_local + 1);
  }
  iVar2 = isneg((char **)&result_local);
  if (((char)*result_local == '0') &&
     ((*(char *)((long)result_local + 1) == 'x' || (*(char *)((long)result_local + 1) == 'X')))) {
    result_local = (lua_Integer *)((long)result_local + 2);
    while ((""[(int)((byte)*result_local + 1)] & 0x10) != 0) {
      iVar3 = luaO_hexavalue((int)(char)*result_local);
      _neg = _neg * 0x10 + (long)iVar3;
      bVar1 = false;
      result_local = (lua_Integer *)((long)result_local + 1);
    }
  }
  else {
    while ((""[(int)((byte)*result_local + 1)] & 2) != 0) {
      iVar3 = (char)*result_local + -0x30;
      if ((0xccccccccccccccb < _neg) && ((0xccccccccccccccc < _neg || (iVar2 + 7 < iVar3)))) {
        return (char *)0x0;
      }
      _neg = _neg * 10 + (long)iVar3;
      bVar1 = false;
      result_local = (lua_Integer *)((long)result_local + 1);
    }
  }
  while ((""[(int)((byte)*result_local + 1)] & 8) != 0) {
    result_local = (lua_Integer *)((long)result_local + 1);
  }
  if ((bVar1) || ((char)*result_local != '\0')) {
    s_local = (char *)0x0;
  }
  else {
    if (iVar2 == 0) {
      local_48 = _neg;
    }
    else {
      local_48 = -_neg;
    }
    *result = local_48;
    s_local = (char *)result_local;
  }
  return s_local;
}

Assistant:

static const char *l_str2int (const char *s, lua_Integer *result) {
  lua_Unsigned a = 0;
  int empty = 1;
  int neg;
  while (lisspace(cast_uchar(*s))) s++;  /* skip initial spaces */
  neg = isneg(&s);
  if (s[0] == '0' &&
      (s[1] == 'x' || s[1] == 'X')) {  /* hex? */
    s += 2;  /* skip '0x' */
    for (; lisxdigit(cast_uchar(*s)); s++) {
      a = a * 16 + luaO_hexavalue(*s);
      empty = 0;
    }
  }
  else {  /* decimal */
    for (; lisdigit(cast_uchar(*s)); s++) {
      int d = *s - '0';
      if (a >= MAXBY10 && (a > MAXBY10 || d > MAXLASTD + neg))  /* overflow? */
        return NULL;  /* do not accept it (as integer) */
      a = a * 10 + d;
      empty = 0;
    }
  }
  while (lisspace(cast_uchar(*s))) s++;  /* skip trailing spaces */
  if (empty || *s != '\0') return NULL;  /* something wrong in the numeral */
  else {
    *result = l_castU2S((neg) ? 0u - a : a);
    return s;
  }
}